

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O2

set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_> *
dg::pta::getReachableNodes
          (set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
           *__return_storage_ptr__,PSNode *n,PSNode *exit,bool interproc)

{
  _Rb_tree_header *p_Var1;
  pointer ppPVar2;
  _func_int **pp_Var3;
  undefined7 in_register_00000009;
  _func_int **pp_Var4;
  pointer ppPVar5;
  pair<std::_Rb_tree_iterator<dg::pta::PSNode_*>,_bool> pVar6;
  PSNode *cur;
  PSNode *succ;
  QueueFIFO<dg::pta::PSNode_*> fifo;
  PSNode *local_a0;
  undefined4 local_94;
  PSNode *local_90;
  PSNode *local_88;
  QueueFIFO<dg::pta::PSNode_*> local_80;
  
  local_94 = (undefined4)CONCAT71(in_register_00000009,interproc);
  local_88 = n;
  std::queue<dg::pta::PSNode*,std::deque<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>::
  queue<std::deque<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>,void>(&local_80.Container);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::deque<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::push_back
            ((deque<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)&local_80,&local_88);
  while (local_80.Container.c.
         super__Deque_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
         super__Deque_impl_data._M_finish._M_cur !=
         local_80.Container.c.
         super__Deque_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur) {
    local_a0 = ADT::QueueFIFO<dg::pta::PSNode_*>::pop(&local_80);
    pVar6 = std::
            _Rb_tree<dg::pta::PSNode*,dg::pta::PSNode*,std::_Identity<dg::pta::PSNode*>,std::less<dg::pta::PSNode*>,std::allocator<dg::pta::PSNode*>>
            ::_M_insert_unique<dg::pta::PSNode*const&>
                      ((_Rb_tree<dg::pta::PSNode*,dg::pta::PSNode*,std::_Identity<dg::pta::PSNode*>,std::less<dg::pta::PSNode*>,std::allocator<dg::pta::PSNode*>>
                        *)__return_storage_ptr__,&local_a0);
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      ppPVar2 = (local_a0->super_SubgraphNode<dg::pta::PSNode>)._successors.
                super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppPVar5 = (local_a0->super_SubgraphNode<dg::pta::PSNode>)._successors.
                     super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppPVar5 != ppPVar2;
          ppPVar5 = ppPVar5 + 1) {
        local_90 = *ppPVar5;
        if (local_90 != exit) {
          std::deque<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::push_back
                    ((deque<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)&local_80,
                     &local_90);
        }
      }
      if ((char)local_94 != '\0') {
        if (local_a0 == (PSNode *)0x0 || (local_a0->type & ~ALLOC) != CALL) {
          if (local_a0->type == RETURN && local_a0 != (PSNode *)0x0) {
            pp_Var3 = *(_func_int ***)&local_a0[1].super_SubgraphNode<dg::pta::PSNode>;
            for (pp_Var4 = local_a0[1]._vptr_PSNode; pp_Var4 != pp_Var3; pp_Var4 = pp_Var4 + 1) {
              local_90 = (PSNode *)*pp_Var4;
              if (local_90 != exit) {
                std::deque<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::push_back
                          ((deque<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)&local_80
                           ,&local_90);
              }
            }
          }
        }
        else {
          pp_Var3 = *(_func_int ***)&local_a0[1].super_SubgraphNode<dg::pta::PSNode>;
          for (pp_Var4 = local_a0[1]._vptr_PSNode; pp_Var4 != pp_Var3; pp_Var4 = pp_Var4 + 1) {
            if (*(PSNode **)(*pp_Var4 + 0x58) != exit) {
              std::deque<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::push_back
                        ((deque<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)&local_80,
                         (value_type *)(*pp_Var4 + 0x58));
            }
          }
        }
      }
    }
  }
  std::_Deque_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::~_Deque_base
            ((_Deque_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

inline std::set<PSNode *> getReachableNodes(PSNode *n, PSNode *exit = nullptr,
                                            bool interproc = true) {
    ADT::QueueFIFO<PSNode *> fifo;
    std::set<PSNode *> cont;

    assert(n && "No starting node given.");
    fifo.push(n);

    while (!fifo.empty()) {
        PSNode *cur = fifo.pop();
        if (!cont.insert(cur).second)
            continue; // we already visited this node

        for (PSNode *succ : cur->successors()) {
            assert(succ != nullptr);

            if (succ == exit)
                continue;

            fifo.push(succ);
        }

        if (interproc) {
            if (PSNodeCall *C = PSNodeCall::get(cur)) {
                for (auto *subg : C->getCallees()) {
                    if (subg->root == exit)
                        continue;
                    fifo.push(subg->root);
                }
            } else if (PSNodeRet *R = PSNodeRet::get(cur)) {
                for (auto *ret : R->getReturnSites()) {
                    if (ret == exit)
                        continue;
                    fifo.push(ret);
                }
            }
        }
    }

    return cont;
}